

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

void __thiscall soul::RenderingVenue::Pimpl::addActiveSession(Pimpl *this,SessionImpl *session)

{
  value_type local_28;
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> l;
  SessionImpl *session_local;
  Pimpl *this_local;
  
  l._M_device = (mutex_type *)session;
  std::lock_guard<std::mutex>::lock_guard(&local_20,&this->sessionListLock);
  local_28 = (value_type)l._M_device;
  std::
  vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
  ::push_back(&this->activeSessions,&local_28);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void addActiveSession (SessionImpl& session)
    {
        std::lock_guard<std::mutex> l (sessionListLock);
        activeSessions.push_back (std::addressof (session));
    }